

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapepiram.cpp
# Opt level: O2

void __thiscall
pzshape::TPZShapePiram::ShapeCorner
          (TPZShapePiram *this,TPZVec<double> *pt,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  _func_int *p_Var1;
  _func_int **pp_Var2;
  undefined1 auVar3 [16];
  _func_int *p_Var4;
  double *pdVar5;
  int iVar6;
  undefined4 uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double local_88;
  double local_78;
  
  pp_Var2 = this[1].super_TPZPyramid.super_TPZSavable._vptr_TPZSavable;
  p_Var1 = *pp_Var2;
  p_Var4 = pp_Var2[1];
  auVar12._8_4_ = (int)-(ulong)(ABS((double)p_Var4) < 1e-10);
  auVar12._0_8_ = -(ulong)(ABS((double)p_Var1) < 1e-10);
  auVar12._12_4_ = (int)(-(ulong)(ABS((double)p_Var4) < 1e-10) >> 0x20);
  iVar6 = movmskpd((int)dphi,auVar12);
  if (((iVar6 != 3) || ((double)pp_Var2[2] != 1.0)) || (NAN((double)pp_Var2[2]))) {
    local_78 = 1.0 - (double)pp_Var2[2];
    uVar7 = (undefined4)((ulong)local_78 >> 0x20);
    auVar14._0_8_ = (local_78 - (double)p_Var1) * 0.5;
    auVar14._8_8_ = (local_78 - (double)p_Var4) * 0.5;
    auVar15._8_4_ = SUB84(local_78,0);
    auVar15._0_8_ = local_78;
    auVar15._12_4_ = uVar7;
    auVar15 = divpd(auVar14,auVar15);
    auVar11._0_8_ = ((double)p_Var1 + local_78) * 0.5;
    auVar11._8_8_ = ((double)p_Var4 + local_78) * 0.5;
    auVar3._8_4_ = SUB84(local_78,0);
    auVar3._0_8_ = local_78;
    auVar3._12_4_ = uVar7;
    auVar12 = divpd(auVar11,auVar3);
    pdVar5 = TPZFMatrix<double>::operator()((TPZFMatrix<double> *)pt,0,0);
    *pdVar5 = auVar15._0_8_ * auVar15._8_8_ * local_78;
    local_88 = auVar12._0_8_;
    pdVar5 = TPZFMatrix<double>::operator()((TPZFMatrix<double> *)pt,1,0);
    *pdVar5 = auVar15._8_8_ * local_88 * local_78;
    pdVar5 = TPZFMatrix<double>::operator()((TPZFMatrix<double> *)pt,2,0);
    *pdVar5 = local_88 * auVar12._8_8_ * local_78;
    pdVar5 = TPZFMatrix<double>::operator()((TPZFMatrix<double> *)pt,3,0);
    *pdVar5 = auVar12._8_8_ * auVar15._0_8_ * local_78;
    p_Var1 = this[1].super_TPZPyramid.super_TPZSavable._vptr_TPZSavable[2];
    pdVar5 = TPZFMatrix<double>::operator()((TPZFMatrix<double> *)pt,4,0);
    *pdVar5 = (double)p_Var1;
    pp_Var2 = this[1].super_TPZPyramid.super_TPZSavable._vptr_TPZSavable;
    p_Var1 = pp_Var2[2];
    dVar10 = (1.0 - (double)*pp_Var2) - (double)p_Var1;
    dVar13 = (1.0 - (double)pp_Var2[1]) - (double)p_Var1;
    dVar8 = ((double)*pp_Var2 + 1.0) - (double)p_Var1;
    dVar9 = ((double)pp_Var2[1] + 1.0) - (double)p_Var1;
    pdVar5 = TPZFMatrix<double>::operator()(phi,0,0);
    *pdVar5 = (dVar13 * -0.25) / local_78;
    pdVar5 = TPZFMatrix<double>::operator()(phi,1,0);
    *pdVar5 = (dVar10 * -0.25) / local_78;
    pdVar5 = TPZFMatrix<double>::operator()(phi,2,0);
    *pdVar5 = (((dVar10 + dVar13) - (dVar10 * dVar13) / local_78) * -0.25) / local_78;
    pdVar5 = TPZFMatrix<double>::operator()(phi,0,1);
    *pdVar5 = (dVar13 * 0.25) / local_78;
    pdVar5 = TPZFMatrix<double>::operator()(phi,1,1);
    *pdVar5 = (dVar8 * -0.25) / local_78;
    pdVar5 = TPZFMatrix<double>::operator()(phi,2,1);
    *pdVar5 = (((dVar8 + dVar13) - (dVar13 * dVar8) / local_78) * -0.25) / local_78;
    pdVar5 = TPZFMatrix<double>::operator()(phi,0,2);
    *pdVar5 = (dVar9 * 0.25) / local_78;
    pdVar5 = TPZFMatrix<double>::operator()(phi,1,2);
    *pdVar5 = (dVar8 * 0.25) / local_78;
    pdVar5 = TPZFMatrix<double>::operator()(phi,2,2);
    *pdVar5 = (((dVar8 + dVar9) - (dVar8 * dVar9) / local_78) * -0.25) / local_78;
    pdVar5 = TPZFMatrix<double>::operator()(phi,0,3);
    *pdVar5 = (dVar9 * -0.25) / local_78;
    pdVar5 = TPZFMatrix<double>::operator()(phi,1,3);
    *pdVar5 = (dVar10 * 0.25) / local_78;
    local_78 = (((dVar10 + dVar9) - (dVar9 * dVar10) / local_78) * -0.25) / local_78;
  }
  else {
    pdVar5 = TPZFMatrix<double>::operator()((TPZFMatrix<double> *)pt,0,0);
    *pdVar5 = 0.0;
    pdVar5 = TPZFMatrix<double>::operator()((TPZFMatrix<double> *)pt,1,0);
    *pdVar5 = 0.0;
    pdVar5 = TPZFMatrix<double>::operator()((TPZFMatrix<double> *)pt,2,0);
    *pdVar5 = 0.0;
    pdVar5 = TPZFMatrix<double>::operator()((TPZFMatrix<double> *)pt,3,0);
    *pdVar5 = 0.0;
    pdVar5 = TPZFMatrix<double>::operator()((TPZFMatrix<double> *)pt,4,0);
    *pdVar5 = 1.0;
    pdVar5 = TPZFMatrix<double>::operator()(phi,0,0);
    *pdVar5 = -0.25;
    pdVar5 = TPZFMatrix<double>::operator()(phi,1,0);
    *pdVar5 = -0.25;
    pdVar5 = TPZFMatrix<double>::operator()(phi,2,0);
    *pdVar5 = -0.25;
    pdVar5 = TPZFMatrix<double>::operator()(phi,0,1);
    *pdVar5 = 0.25;
    pdVar5 = TPZFMatrix<double>::operator()(phi,1,1);
    *pdVar5 = -0.25;
    pdVar5 = TPZFMatrix<double>::operator()(phi,2,1);
    *pdVar5 = -0.25;
    pdVar5 = TPZFMatrix<double>::operator()(phi,0,2);
    *pdVar5 = 0.25;
    pdVar5 = TPZFMatrix<double>::operator()(phi,1,2);
    *pdVar5 = 0.25;
    pdVar5 = TPZFMatrix<double>::operator()(phi,2,2);
    *pdVar5 = -0.25;
    pdVar5 = TPZFMatrix<double>::operator()(phi,0,3);
    *pdVar5 = -0.25;
    pdVar5 = TPZFMatrix<double>::operator()(phi,1,3);
    *pdVar5 = 0.25;
    local_78 = -0.25;
  }
  pdVar5 = TPZFMatrix<double>::operator()(phi,2,3);
  *pdVar5 = local_78;
  pdVar5 = TPZFMatrix<double>::operator()(phi,0,4);
  *pdVar5 = 0.0;
  pdVar5 = TPZFMatrix<double>::operator()(phi,1,4);
  *pdVar5 = 0.0;
  pdVar5 = TPZFMatrix<double>::operator()(phi,2,4);
  *pdVar5 = 1.0;
  return;
}

Assistant:

void TPZShapePiram::ShapeCorner(const TPZVec<REAL> &pt,TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {
        if(fabs(pt[0])<1.e-10 && fabs(pt[1])<1.e-10 && pt[2]==1.) {
            //para testes com transformaçoes geometricas-->>Que é o que faz o RefPattern!!
            //(0,0,1) nunca é um ponto de integração
            phi(0,0)  = 0.;
            phi(1,0)  = 0.;
            phi(2,0)  = 0.;
            phi(3,0)  = 0.;
            phi(4,0)  = 1.;
            dphi(0,0)  = -0.25;
            dphi(1,0)  = -0.25;
            dphi(2,0)  = -0.25;
            dphi(0,1)  = 0.25;
            dphi(1,1)  = -0.25;
            dphi(2,1)  = -0.25;
            dphi(0,2)  = 0.25;
            dphi(1,2)  = 0.25;
            dphi(2,2)  = -0.25;
            dphi(0,3)  = -0.25;
            dphi(1,3)  = 0.25;
            dphi(2,3)  = -0.25;
            dphi(0,4)  = 0;
            dphi(1,4)  = 0;
            dphi(2,4)  = 1.;
            
            
            
            return;
        }
        
        REAL T0xz = .5*(1.-pt[2]-pt[0]) / (1.-pt[2]);
        REAL T0yz = .5*(1.-pt[2]-pt[1]) / (1.-pt[2]);
        REAL T1xz = .5*(1.-pt[2]+pt[0]) / (1.-pt[2]);
        REAL T1yz = .5*(1.-pt[2]+pt[1]) / (1.-pt[2]);
        REAL lmez = (1.-pt[2]);
        phi(0,0)  = T0xz*T0yz*lmez;
        phi(1,0)  = T1xz*T0yz*lmez;
        phi(2,0)  = T1xz*T1yz*lmez;
        phi(3,0)  = T0xz*T1yz*lmez;
        phi(4,0)  = pt[2];
        REAL lmexmez = 1.-pt[0]-pt[2];
        REAL lmeymez = 1.-pt[1]-pt[2];
        REAL lmaxmez = 1.+pt[0]-pt[2];
        REAL lmaymez = 1.+pt[1]-pt[2];
        dphi(0,0) = -.25*lmeymez / lmez;
        dphi(1,0) = -.25*lmexmez / lmez;
        dphi(2,0) = -.25*(lmeymez+lmexmez-lmexmez*lmeymez/lmez) / lmez;
        
        dphi(0,1) =  .25*lmeymez / lmez;
        dphi(1,1) = -.25*lmaxmez / lmez;
        dphi(2,1) = -.25*(lmeymez+lmaxmez-lmaxmez*lmeymez/lmez) / lmez;
        
        dphi(0,2) =  .25*lmaymez / lmez;
        dphi(1,2) =  .25*lmaxmez / lmez;
        dphi(2,2) = -.25*(lmaymez+lmaxmez-lmaxmez*lmaymez/lmez) / lmez;
        
        dphi(0,3) = -.25*lmaymez / lmez;
        dphi(1,3) =  .25*lmexmez / lmez;
        dphi(2,3) = -.25*(lmaymez+lmexmez-lmexmez*lmaymez/lmez) / lmez;
        
        dphi(0,4) =  0.0;
        dphi(1,4) =  0.0;
        dphi(2,4) =  1.0;
    }